

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cc
# Opt level: O2

float __thiscall Square::Gen(Square *this)

{
  float fVar1;
  
  fVar1 = (this->super_Oscillo).phase_;
  fVar1 = (float)((uint)(fVar1 < 6.2831855) * (int)fVar1 +
                 (uint)(fVar1 >= 6.2831855) * (int)(fVar1 + -6.2831855)) +
          (this->super_Oscillo).phase_incr_;
  (this->super_Oscillo).phase_ = fVar1;
  return (float)((uint)(fVar1 < 3.1415927) * -0x40800000 + (uint)(fVar1 >= 3.1415927) * 0x3f800000);
}

Assistant:

float Square::Gen()
{
    if (this->phase_ >= M_TAU)
        this->phase_ -= M_TAU;

    this->phase_ += this->phase_incr_;

    if (this->phase_ < M_TAUOVR2)
        return -1.f;
    else
        return 1.f;
}